

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ps.c
# Opt level: O1

int bp_decode_ps(mod2sparse *H,char *synd,double error_prob,int max_iter,int *converge,int *iter,
                char *decoding,double *log_prob_ratios)

{
  uint n;
  char *pchk;
  ulong uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  double *log_prob_ratios_00;
  int iVar5;
  
  n = H->n_rows;
  log_prob_ratios_00 = (double *)0x1;
  piVar3 = converge;
  pchk = (char *)chk_alloc(n,1);
  bp_setup_ps(H,error_prob,log_prob_ratios_00,decoding);
  iVar5 = 0;
  if (max_iter < 1) {
    iVar4 = 0;
  }
  else {
    do {
      bp_update_ps(H,synd,log_prob_ratios,(int)piVar3,decoding);
      syndrome(H,decoding,pchk);
      iVar4 = 1;
      if ((int)n < 1) goto LAB_00120b05;
      uVar1 = 0;
      piVar3 = (int *)0x0;
      do {
        uVar2 = (int)piVar3 + (int)(char)(pchk[uVar1] ^ synd[uVar1]);
        piVar3 = (int *)(ulong)uVar2;
        uVar1 = uVar1 + 1;
      } while (n != uVar1);
      if (uVar2 == 0) goto LAB_00120b05;
      iVar5 = iVar5 + 1;
    } while (iVar5 != max_iter);
    iVar4 = 0;
    iVar5 = max_iter;
  }
LAB_00120b05:
  free(pchk);
  *iter = iVar5;
  *converge = iVar4;
  return iVar4;
}

Assistant:

int bp_decode_ps(
mod2sparse *H,
char *synd,
double error_prob,
int max_iter,
int *converge,
int *iter,
char *decoding,
double *log_prob_ratios)
  {

    int M,N;
    int it;
    M = mod2sparse_rows(H);
    N = mod2sparse_cols(H);
    int hamming_weight;
    char *candidate_synd;

    candidate_synd=chk_alloc(M,sizeof(*candidate_synd));

    bp_setup_ps(H,error_prob,log_prob_ratios,decoding);

    for(it=0; it<max_iter;it++)
      {
        bp_update_ps(H,synd, log_prob_ratios, it, decoding);
        syndrome(H,decoding,candidate_synd);

        //check hamming weight between candidate syndrome and target syndrome
        hamming_weight=0;
        for(int check_no=0;check_no<M;check_no++)
          {
            hamming_weight+=synd[check_no]^candidate_synd[check_no];
          }

        //exit if candidate syndrome has converged to the target solution
        if(hamming_weight==0)
          {
            free(candidate_synd);
            *iter=it;
            *converge=1;
            return 1;
          }


      }
 
    free(candidate_synd);
    *iter=it;
    *converge=0;
    return 0;
  }